

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_out_open(PmInternal *midi,void *driverInfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  void *pvVar5;
  PmError err_00;
  long lVar6;
  size_t __n;
  snd_seq_port_info_t *psVar7;
  undefined8 uStack_50;
  void *local_48;
  PmError local_3c;
  void *pvStack_38;
  int err;
  snd_seq_port_info_t *info;
  alsa_descriptor_type desc;
  void *client_port;
  void *driverInfo_local;
  PmInternal *midi_local;
  
  desc = (alsa_descriptor_type)descriptors[midi->device_id].descriptor;
  uStack_50 = 0x10612a;
  client_port = driverInfo;
  driverInfo_local = midi;
  info = (snd_seq_port_info_t *)pm_alloc(0x20);
  if (info == (snd_seq_port_info_t *)0x0) {
    return pmInsufficientMemory;
  }
  uStack_50 = 0x106148;
  lVar6 = snd_seq_port_info_sizeof();
  lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
  local_48 = (void *)((long)&local_48 + lVar6);
  pvStack_38 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x10616d;
  __n = snd_seq_port_info_sizeof();
  pvVar5 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x10617b;
  memset(pvVar5,0,__n);
  pvVar5 = pvStack_38;
  uVar1 = *driverInfo_local;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x10618a;
  snd_seq_port_info_set_port(pvVar5,uVar1);
  pvVar5 = pvStack_38;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x106198;
  snd_seq_port_info_set_capability(pvVar5,3);
  pvVar5 = pvStack_38;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1061a6;
  snd_seq_port_info_set_type(pvVar5,0x100002);
  pvVar5 = pvStack_38;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1061b4;
  snd_seq_port_info_set_port_specified(pvVar5,1);
  pvVar5 = pvStack_38;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1061c4;
  local_3c = snd_seq_create_port(seq,pvVar5);
  if (~pmNoData < local_3c) {
    *(snd_seq_port_info_t **)((long)driverInfo_local + 0x58) = info;
    *(uint *)info = (uint)((ulong)desc >> 8) & 0xff;
    *(uint *)(info + 4) = (uint)desc & 0xff;
    *(undefined4 *)(info + 8) = *driverInfo_local;
    *(undefined4 *)(info + 0xc) = 0;
    *(undefined4 *)(info + 0x18) = 0;
    psVar7 = info + 0x10;
    *(undefined8 *)((long)&uStack_50 + lVar6) = 0x10623c;
    local_3c = snd_midi_event_new(0x400,psVar7);
    if (~pmNoData < local_3c) {
      if (*(int *)((long)driverInfo_local + 0x28) < 1) {
        uVar1 = *(undefined4 *)(info + 8);
        uVar2 = *(undefined4 *)info;
        uVar3 = *(undefined4 *)(info + 4);
        *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1062b1;
        local_3c = snd_seq_connect_to(seq,uVar1,uVar2,uVar3);
        if (~pmNoData < local_3c) {
          return pmNoData;
        }
      }
      else {
        *(undefined8 *)((long)&uStack_50 + lVar6) = 0x106259;
        local_3c = alsa_use_queue();
        if (~pmNoData < local_3c) {
          uVar1 = *(undefined4 *)(info + 8);
          uVar2 = *(undefined4 *)info;
          uVar3 = *(undefined4 *)(info + 4);
          *(undefined8 *)((long)&uStack_50 + lVar6) = 0x106284;
          local_3c = snd_seq_connect_to(seq,uVar1,uVar2,uVar3);
          if (~pmNoData < local_3c) {
            return pmNoData;
          }
          *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1062cc;
          alsa_unuse_queue();
        }
      }
      uVar4 = *(undefined8 *)(info + 0x10);
      *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1062d9;
      snd_midi_event_free(uVar4);
    }
    uVar1 = *(undefined4 *)(info + 8);
    *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1062ec;
    snd_seq_delete_port(seq,uVar1);
  }
  psVar7 = info;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1062f5;
  pm_free(psVar7);
  err_00 = local_3c;
  pm_hosterror = local_3c;
  if (local_3c < pmNoData) {
    *(undefined8 *)((long)&uStack_50 + lVar6) = 0x10631b;
    get_alsa_error_text(pm_hosterror_text,0x100,err_00);
  }
  return pmHostError;
}

Assistant:

static PmError alsa_out_open(PmInternal *midi, void *driverInfo) 
{
    void *client_port = descriptors[midi->device_id].descriptor;
    alsa_descriptor_type desc = (alsa_descriptor_type) 
        pm_alloc(sizeof(alsa_descriptor_node));
    snd_seq_port_info_t *info;
    int err;

    if (!desc) return pmInsufficientMemory;
    
    snd_seq_port_info_alloca(&info);
    snd_seq_port_info_set_port(info, midi->device_id);
    snd_seq_port_info_set_capability(info, SND_SEQ_PORT_CAP_WRITE |
                                     SND_SEQ_PORT_CAP_READ);
    snd_seq_port_info_set_type(info, SND_SEQ_PORT_TYPE_MIDI_GENERIC | 
                                     SND_SEQ_PORT_TYPE_APPLICATION);
    snd_seq_port_info_set_port_specified(info, 1);
    err = snd_seq_create_port(seq, info);
    if (err < 0) goto free_desc;

    /* fill in fields of desc, which is passed to pm_write routines */
    midi->descriptor = desc;
    desc->client = GET_DESCRIPTOR_CLIENT(client_port);
    desc->port = GET_DESCRIPTOR_PORT(client_port);
    desc->this_port = midi->device_id;
    desc->in_sysex = 0;

    desc->error = 0;

    err = snd_midi_event_new(PM_DEFAULT_SYSEX_BUFFER_SIZE, &desc->parser);
    if (err < 0) goto free_this_port;

    if (midi->latency > 0) { /* must delay output using a queue */
        err = alsa_use_queue();
        if (err < 0) goto free_parser;

        err = snd_seq_connect_to(seq, desc->this_port, desc->client, desc->port);
        if (err < 0) goto unuse_queue;  /* clean up and return on error */
    } else {
        err = snd_seq_connect_to(seq, desc->this_port, desc->client, desc->port);
        if (err < 0) goto free_parser;  /* clean up and return on error */
    }        
    return pmNoError;

 unuse_queue:
    alsa_unuse_queue();
 free_parser:
    snd_midi_event_free(desc->parser);
 free_this_port:
    snd_seq_delete_port(seq, desc->this_port);
 free_desc:
    pm_free(desc);
    pm_hosterror = err;
    if (err < 0) {
        get_alsa_error_text(pm_hosterror_text, PM_HOST_ERROR_MSG_LEN, err);
    }
    return pmHostError;
}